

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Bool FT_Get_Color_Glyph_Layer
                  (FT_Face face,FT_UInt base_glyph,FT_UInt *aglyph_index,FT_UInt *acolor_index,
                  FT_LayerIterator *iterator)

{
  SFNT_Service sfnt;
  TT_Face_conflict ttface;
  FT_LayerIterator *iterator_local;
  FT_UInt *acolor_index_local;
  FT_UInt *aglyph_index_local;
  FT_UInt base_glyph_local;
  FT_Face face_local;
  
  if ((((face == (FT_Face)0x0) || (aglyph_index == (FT_UInt *)0x0)) ||
      (acolor_index == (FT_UInt *)0x0)) ||
     ((iterator == (FT_LayerIterator *)0x0 || ((uint)face->num_glyphs <= base_glyph)))) {
    face_local._7_1_ = '\0';
  }
  else if ((face->face_flags & 8U) == 0) {
    face_local._7_1_ = '\0';
  }
  else if (*(long *)(*(long *)&face[3].units_per_EM + 0x108) == 0) {
    face_local._7_1_ = '\0';
  }
  else {
    face_local._7_1_ =
         (**(code **)(*(long *)&face[3].units_per_EM + 0x108))
                   (face,base_glyph,aglyph_index,acolor_index,iterator);
  }
  return face_local._7_1_;
}

Assistant:

FT_EXPORT_DEF( FT_Bool )
  FT_Get_Color_Glyph_Layer( FT_Face            face,
                            FT_UInt            base_glyph,
                            FT_UInt           *aglyph_index,
                            FT_UInt           *acolor_index,
                            FT_LayerIterator*  iterator )
  {
    TT_Face       ttface;
    SFNT_Service  sfnt;


    if ( !face                                   ||
         !aglyph_index                           ||
         !acolor_index                           ||
         !iterator                               ||
         base_glyph >= (FT_UInt)face->num_glyphs )
      return 0;

    if ( !FT_IS_SFNT( face ) )
      return 0;

    ttface = (TT_Face)face;
    sfnt   = (SFNT_Service)ttface->sfnt;

    if ( sfnt->get_colr_layer )
      return sfnt->get_colr_layer( ttface,
                                   base_glyph,
                                   aglyph_index,
                                   acolor_index,
                                   iterator );
    else
      return 0;
  }